

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsscreen.cpp
# Opt level: O0

QString * __thiscall QEglFSKmsScreen::model(QEglFSKmsScreen *this)

{
  bool bVar1;
  QString *this_00;
  long in_RSI;
  QString *in_RDI;
  QString *in_stack_ffffffffffffffc8;
  
  bVar1 = QString::isEmpty((QString *)0x10e0b9);
  if (bVar1) {
    this_00 = (QString *)(in_RSI + 0x118);
  }
  else {
    this_00 = (QString *)(in_RSI + 0x148);
  }
  QString::QString(this_00,in_stack_ffffffffffffffc8);
  return in_RDI;
}

Assistant:

QString QEglFSKmsScreen::model() const
{
    return m_edid.model.isEmpty() ? m_edid.identifier : m_edid.model;
}